

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O1

void __thiscall
helics::apps::Tracer::loadJsonFile
          (Tracer *this,string *jsonString,bool enableFederateInterfaceRegistration)

{
  _Map_pointer ppIVar1;
  _Map_pointer ppEVar2;
  _Map_pointer ppEVar3;
  _Elt_pointer pEVar4;
  _Elt_pointer pEVar5;
  bool bVar6;
  int iVar7;
  Input *__args;
  string *psVar8;
  Endpoint *pEVar9;
  mapped_type *pmVar10;
  reference pvVar11;
  reference pbVar12;
  ulong uVar13;
  _Elt_pointer pIVar14;
  int iVar15;
  string_view key;
  string_view sourceEndpoint;
  string_view destEndpoint;
  string_view sourceEndpoint_00;
  string_view destEndpoint_00;
  string_view key_00;
  string_view sourceEndpoint_01;
  string_view destEndpoint_01;
  string_view sourceEndpoint_02;
  string_view destEndpoint_02;
  iterator __begin3;
  iterator __end3;
  value_type clones;
  value_type captures;
  value_type destClone;
  value_type sourceClone;
  value_type tags;
  json doc;
  string local_108;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  local_e8;
  long *local_c8;
  size_t local_c0;
  long local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  data local_58;
  string *local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"tracer","");
  apps::App::loadJsonFileConfiguration
            (&this->super_App,&local_108,jsonString,enableFederateInterfaceRegistration);
  local_48 = jsonString;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  iVar7 = helics::ValueFederate::getInputCount
                    (&((this->super_App).fed.
                       super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->super_ValueFederate);
  if (0 < iVar7) {
    iVar15 = 0;
    do {
      __args = helics::ValueFederate::getInput
                         (&((this->super_App).fed.
                            super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->super_ValueFederate,iVar15);
      std::deque<helics::Input,std::allocator<helics::Input>>::emplace_back<helics::Input&>
                ((deque<helics::Input,std::allocator<helics::Input>> *)&this->subscriptions,__args);
      pIVar14 = (this->subscriptions).
                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                super__Deque_impl_data._M_finish._M_cur;
      if (pIVar14 ==
          (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_first) {
        pIVar14 = (this->subscriptions).
                  super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node[-1] + 1;
      }
      psVar8 = Interface::getName_abi_cxx11_(&pIVar14[-1].super_Interface);
      ppIVar1 = (this->subscriptions).
                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      local_108._M_dataplus._M_p._0_4_ =
           (int)((ulong)((long)(this->subscriptions).
                               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_last -
                        (long)(this->subscriptions).
                              super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                              _M_impl.super__Deque_impl_data._M_start._M_cur) >> 4) * 0x286bca1b +
           (int)((ulong)((long)(this->subscriptions).
                               super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                               _M_impl.super__Deque_impl_data._M_finish._M_cur -
                        (long)(this->subscriptions).
                              super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                              _M_impl.super__Deque_impl_data._M_finish._M_first) >> 4) * 0x286bca1b
           + (int)((ulong)((long)ppIVar1 -
                          (long)(this->subscriptions).
                                super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) +
             (uint)(ppIVar1 == (_Map_pointer)0x0) + -2;
      std::
      _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,int>
                ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,int>>>
                  *)&this->subkeys,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar8,
                 (int *)&local_108);
      iVar15 = iVar15 + 1;
    } while (iVar7 != iVar15);
  }
  iVar7 = helics::MessageFederate::getEndpointCount
                    ((MessageFederate *)
                     &(((this->super_App).fed.
                        super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->super_ValueFederate).field_0x10);
  if (0 < iVar7) {
    iVar15 = 0;
    do {
      pEVar9 = helics::MessageFederate::getEndpoint
                         ((MessageFederate *)
                          &(((this->super_App).fed.
                             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->super_ValueFederate).field_0x10,iVar15);
      std::deque<helics::Endpoint,std::allocator<helics::Endpoint>>::emplace_back<helics::Endpoint&>
                ((deque<helics::Endpoint,std::allocator<helics::Endpoint>> *)&this->endpoints,pEVar9
                );
      ppEVar2 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_finish._M_node;
      ppEVar3 = (this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
      pEVar9 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      uVar13 = (long)pEVar9 -
               (long)(this->endpoints).
                     super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_first;
      if (uVar13 == 0) {
        pEVar9 = ppEVar2[-1] + 4;
      }
      pEVar4 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_start._M_last;
      pEVar5 = (this->endpoints).
               super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
               super__Deque_impl_data._M_start._M_cur;
      psVar8 = Interface::getName_abi_cxx11_(&pEVar9[-1].super_Interface);
      local_108._M_string_length = (size_type)(psVar8->_M_dataplus)._M_p;
      local_108._M_dataplus._M_p = (pointer)psVar8->_M_string_length;
      pmVar10 = CLI::std::
                map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
                ::operator[](&this->eptNames,(key_type *)&local_108);
      *pmVar10 = (int)((ulong)((long)pEVar4 - (long)pEVar5) >> 3) * -0x11111111 +
                 (int)(uVar13 >> 3) * -0x11111111 +
                 ((int)((ulong)((long)ppEVar2 - (long)ppEVar3) >> 3) + -1 +
                 (uint)(ppEVar2 == (_Map_pointer)0x0)) * 4 + -1;
      iVar15 = iVar15 + 1;
    } while (iVar7 != iVar15);
  }
  fileops::loadJson((fileops *)(local_68 + 0x10),(string *)local_48);
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_68 + 0x10),"tag");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_68,pvVar11);
  if (local_68[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_108,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_68);
    key._M_str = local_108._M_dataplus._M_p;
    key._M_len = local_108._M_string_length;
    addSubscription(this,key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  else if (local_68[0] == array) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((iterator *)&local_108,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)local_68);
    local_e8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_e8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_e8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (local_68[0] == array) {
      local_e8.m_it.array_iterator._M_current =
           (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              *)local_68._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    }
    else if (local_68[0] == object) {
      local_e8.m_it.object_iterator._M_node =
           &(((_Rep_type *)local_68._8_8_)->_M_impl).super__Rb_tree_header._M_header;
    }
    else {
      local_e8.m_it.primitive_iterator.m_it = 1;
    }
    local_e8.m_object = (pointer)local_68;
    while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_108,&local_e8), !bVar6) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_108);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_c8,pbVar12);
      key_00._M_str = (char *)local_c8;
      key_00._M_len = local_c0;
      addSubscription(this,key_00);
      if (local_c8 != local_b8) {
        operator_delete(local_c8,local_b8[0] + 1);
      }
      if (*local_108._M_dataplus._M_p == '\x02') {
        local_108.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity + 0x10;
      }
      else if (*local_108._M_dataplus._M_p == '\x01') {
        local_108._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_108._M_string_length);
      }
      else {
        local_108.field_2._8_8_ = local_108.field_2._8_8_ + 1;
      }
    }
  }
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_68 + 0x10),"sourceclone");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_78,pvVar11);
  if (local_78[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_108,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_78);
    sourceEndpoint._M_str = local_108._M_dataplus._M_p;
    sourceEndpoint._M_len = local_108._M_string_length;
    addSourceEndpointClone(this,sourceEndpoint);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  else if (local_78[0] == array) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((iterator *)&local_108,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)local_78);
    local_e8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_e8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_e8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (local_78[0] == array) {
      local_e8.m_it.array_iterator._M_current =
           (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              *)local_78._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    }
    else if (local_78[0] == object) {
      local_e8.m_it.object_iterator._M_node =
           &(((_Rep_type *)local_78._8_8_)->_M_impl).super__Rb_tree_header._M_header;
    }
    else {
      local_e8.m_it.primitive_iterator.m_it = 1;
    }
    local_e8.m_object = (pointer)local_78;
    while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_108,&local_e8), !bVar6) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_108);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_c8,pbVar12);
      sourceEndpoint_01._M_str = (char *)local_c8;
      sourceEndpoint_01._M_len = local_c0;
      addSourceEndpointClone(this,sourceEndpoint_01);
      if (local_c8 != local_b8) {
        operator_delete(local_c8,local_b8[0] + 1);
      }
      if (*local_108._M_dataplus._M_p == '\x02') {
        local_108.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity + 0x10;
      }
      else if (*local_108._M_dataplus._M_p == '\x01') {
        local_108._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_108._M_string_length);
      }
      else {
        local_108.field_2._8_8_ = local_108.field_2._8_8_ + 1;
      }
    }
  }
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_68 + 0x10),"destclone");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_88,pvVar11);
  if (local_88[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_108,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_88);
    destEndpoint._M_str = local_108._M_dataplus._M_p;
    destEndpoint._M_len = local_108._M_string_length;
    addDestEndpointClone(this,destEndpoint);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  else if (local_88[0] == array) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((iterator *)&local_108,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)local_88);
    local_e8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_e8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_e8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (local_88[0] == array) {
      local_e8.m_it.array_iterator._M_current =
           (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              *)local_88._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    }
    else if (local_88[0] == object) {
      local_e8.m_it.object_iterator._M_node =
           &(((_Rep_type *)local_88._8_8_)->_M_impl).super__Rb_tree_header._M_header;
    }
    else {
      local_e8.m_it.primitive_iterator.m_it = 1;
    }
    local_e8.m_object = (pointer)local_88;
    while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_108,&local_e8), !bVar6) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_108);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_c8,pbVar12);
      destEndpoint_01._M_str = (char *)local_c8;
      destEndpoint_01._M_len = local_c0;
      addDestEndpointClone(this,destEndpoint_01);
      if (local_c8 != local_b8) {
        operator_delete(local_c8,local_b8[0] + 1);
      }
      if (*local_108._M_dataplus._M_p == '\x02') {
        local_108.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity + 0x10;
      }
      else if (*local_108._M_dataplus._M_p == '\x01') {
        local_108._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_108._M_string_length);
      }
      else {
        local_108.field_2._8_8_ = local_108.field_2._8_8_ + 1;
      }
    }
  }
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_68 + 0x10),"clone");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_a8,pvVar11);
  if (local_a8[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_108,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_a8);
    sourceEndpoint_00._M_str = local_108._M_dataplus._M_p;
    sourceEndpoint_00._M_len = local_108._M_string_length;
    addSourceEndpointClone(this,sourceEndpoint_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_108,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_a8);
    destEndpoint_00._M_str = local_108._M_dataplus._M_p;
    destEndpoint_00._M_len = local_108._M_string_length;
    addDestEndpointClone(this,destEndpoint_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  else if (local_a8[0] == array) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((iterator *)&local_108,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)local_a8);
    local_e8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_e8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_e8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (local_a8[0] == array) {
      local_e8.m_it.array_iterator._M_current =
           (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              *)local_a8._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    }
    else if (local_a8[0] == object) {
      local_e8.m_it.object_iterator._M_node =
           &(((_Rep_type *)local_a8._8_8_)->_M_impl).super__Rb_tree_header._M_header;
    }
    else {
      local_e8.m_it.primitive_iterator.m_it = 1;
    }
    local_e8.m_object = (pointer)local_a8;
    while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_108,&local_e8), !bVar6) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_108);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_c8,pbVar12);
      sourceEndpoint_02._M_str = (char *)local_c8;
      sourceEndpoint_02._M_len = local_c0;
      addSourceEndpointClone(this,sourceEndpoint_02);
      if (local_c8 != local_b8) {
        operator_delete(local_c8,local_b8[0] + 1);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_c8,pbVar12);
      destEndpoint_02._M_str = (char *)local_c8;
      destEndpoint_02._M_len = local_c0;
      addDestEndpointClone(this,destEndpoint_02);
      if (local_c8 != local_b8) {
        operator_delete(local_c8,local_b8[0] + 1);
      }
      if (*local_108._M_dataplus._M_p == '\x02') {
        local_108.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity + 0x10;
      }
      else if (*local_108._M_dataplus._M_p == '\x01') {
        local_108._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_108._M_string_length);
      }
      else {
        local_108.field_2._8_8_ = local_108.field_2._8_8_ + 1;
      }
    }
  }
  pvVar11 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            ::operator[]<char_const>
                      ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        *)(local_68 + 0x10),"capture");
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_98,pvVar11);
  if (local_98[0] == string) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_108,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)local_98);
    local_e8.m_object = (pointer)local_108._M_string_length;
    local_e8.m_it.object_iterator._M_node = (_Base_ptr)local_108._M_dataplus._M_p;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->captureInterfaces,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != &local_108.field_2) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
  }
  else if (local_98[0] == array) {
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::begin((iterator *)&local_108,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
             *)local_98);
    local_e8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    local_e8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          *)0x0;
    local_e8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    if (local_98[0] == array) {
      local_e8.m_it.array_iterator._M_current =
           (((_Vector_base<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_std::allocator<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>_>
              *)local_98._8_8_)->_M_impl).super__Vector_impl_data._M_finish;
    }
    else if (local_98[0] == object) {
      local_e8.m_it.object_iterator._M_node =
           &(((_Rep_type *)local_98._8_8_)->_M_impl).super__Rb_tree_header._M_header;
    }
    else {
      local_e8.m_it.primitive_iterator.m_it = 1;
    }
    local_e8.m_object = (pointer)local_98;
    while (bVar6 = nlohmann::json_abi_v3_11_3::detail::
                   iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                   ::
                   operator==<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                             ((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                               *)&local_108,&local_e8), !bVar6) {
      pbVar12 = nlohmann::json_abi_v3_11_3::detail::
                iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                ::operator*((iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                             *)&local_108);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (&local_c8,pbVar12);
      local_40._M_len = local_c0;
      local_40._M_str = (char *)local_c8;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &this->captureInterfaces,&local_40);
      if (local_c8 != local_b8) {
        operator_delete(local_c8,local_b8[0] + 1);
      }
      if (*local_108._M_dataplus._M_p == '\x02') {
        local_108.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity + 0x10;
      }
      else if (*local_108._M_dataplus._M_p == '\x01') {
        local_108._M_string_length =
             std::_Rb_tree_increment((_Rb_tree_node_base *)local_108._M_string_length);
      }
      else {
        local_108.field_2._8_8_ = local_108.field_2._8_8_ + 1;
      }
    }
  }
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_98);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_a8);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_88);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_78);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)local_68);
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data((data *)(local_68 + 0x10));
  return;
}

Assistant:

void Tracer::loadJsonFile(const std::string& jsonString, bool enableFederateInterfaceRegistration)
{
    loadJsonFileConfiguration("tracer", jsonString, enableFederateInterfaceRegistration);

    auto subCount = fed->getInputCount();
    for (int ii = 0; ii < subCount; ++ii) {
        subscriptions.emplace_back(fed->getInput(ii));
        subkeys.emplace(subscriptions.back().getName(), static_cast<int>(subscriptions.size()) - 1);
    }
    auto eptCount = fed->getEndpointCount();
    for (int ii = 0; ii < eptCount; ++ii) {
        endpoints.emplace_back(fed->getEndpoint(ii));
        eptNames[endpoints.back().getName()] = static_cast<int>(endpoints.size() - 1);
    }

    auto doc = fileops::loadJson(jsonString);

    auto tags = doc["tag"];
    if (tags.is_array()) {
        for (const auto& tag : tags) {
            addSubscription(tag.get<std::string>());
        }
    } else if (tags.is_string()) {
        addSubscription(tags.get<std::string>());
    }
    auto sourceClone = doc["sourceclone"];
    if (sourceClone.is_array()) {
        for (const auto& clone : sourceClone) {
            addSourceEndpointClone(clone.get<std::string>());
        }
    } else if (sourceClone.is_string()) {
        addSourceEndpointClone(sourceClone.get<std::string>());
    }
    auto destClone = doc["destclone"];
    if (destClone.is_array()) {
        for (const auto& clone : destClone) {
            addDestEndpointClone(clone.get<std::string>());
        }
    } else if (destClone.is_string()) {
        addDestEndpointClone(destClone.get<std::string>());
    }
    auto clones = doc["clone"];
    if (clones.is_array()) {
        for (const auto& clone : clones) {
            addSourceEndpointClone(clone.get<std::string>());
            addDestEndpointClone(clone.get<std::string>());
        }
    } else if (clones.is_string()) {
        addSourceEndpointClone(clones.get<std::string>());
        addDestEndpointClone(clones.get<std::string>());
    }
    auto captures = doc["capture"];
    if (captures.is_array()) {
        for (const auto& capture : captures) {
            addCapture(capture.get<std::string>());
        }
    } else if (captures.is_string()) {
        addCapture(captures.get<std::string>());
    }
}